

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

CPubKey * AddrToPubKey(CPubKey *__return_storage_ptr__,FillableSigningProvider *keystore,
                      string *addr_in)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  UniValue *pUVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  long in_FS_OFFSET;
  allocator<char> local_b5;
  CKeyID key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  CTxDestination dest;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  DecodeDestination(&dest,addr_in);
  bVar2 = IsValidDestination(&dest);
  if (bVar2) {
    GetKeyForDestination(&key,&keystore->super_SigningProvider,&dest);
    bVar2 = base_blob<160U>::IsNull((base_blob<160U> *)&key);
    if (bVar2) {
      pUVar4 = (UniValue *)__cxa_allocate_exception(0x58);
      tinyformat::format<std::__cxx11::string>
                (&local_a0,(tinyformat *)"\'%s\' does not refer to a key",(char *)addr_in,in_RCX);
      JSONRPCError(pUVar4,-5,&local_a0);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pUVar4,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
    else {
      __return_storage_ptr__->vch[0] = 0xff;
      iVar3 = (*(keystore->super_SigningProvider)._vptr_SigningProvider[4])
                        (keystore,&key,__return_storage_ptr__);
      if ((char)iVar3 == '\0') {
        pUVar4 = (UniValue *)__cxa_allocate_exception(0x58);
        tinyformat::format<std::__cxx11::string>
                  (&local_a0,(tinyformat *)"no full public key for address %s",(char *)addr_in,
                   in_RCX);
        JSONRPCError(pUVar4,-5,&local_a0);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pUVar4,&UniValue::typeinfo,UniValue::~UniValue);
        }
      }
      else {
        bVar2 = CPubKey::IsFullyValid(__return_storage_ptr__);
        if (bVar2) {
          std::__detail::__variant::
          _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                               *)&dest);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            return __return_storage_ptr__;
          }
        }
        else {
          pUVar4 = (UniValue *)__cxa_allocate_exception(0x58);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a0,"Wallet contains an invalid public key",&local_b5);
          JSONRPCError(pUVar4,-0x7f5b,&local_a0);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(pUVar4,&UniValue::typeinfo,UniValue::~UniValue);
          }
        }
      }
    }
  }
  else {
    pUVar4 = (UniValue *)__cxa_allocate_exception(0x58);
    std::operator+(&local_a0,"Invalid address: ",addr_in);
    JSONRPCError(pUVar4,-5,&local_a0);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pUVar4,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  __stack_chk_fail();
}

Assistant:

CPubKey AddrToPubKey(const FillableSigningProvider& keystore, const std::string& addr_in)
{
    CTxDestination dest = DecodeDestination(addr_in);
    if (!IsValidDestination(dest)) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid address: " + addr_in);
    }
    CKeyID key = GetKeyForDestination(keystore, dest);
    if (key.IsNull()) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, strprintf("'%s' does not refer to a key", addr_in));
    }
    CPubKey vchPubKey;
    if (!keystore.GetPubKey(key, vchPubKey)) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, strprintf("no full public key for address %s", addr_in));
    }
    if (!vchPubKey.IsFullyValid()) {
       throw JSONRPCError(RPC_INTERNAL_ERROR, "Wallet contains an invalid public key");
    }
    return vchPubKey;
}